

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O1

PyObject * PyInit_slopeOP(void)

{
  int iVar1;
  char *pcVar2;
  function_record *pfVar3;
  class_<PeltResult<float,float>> *pcVar4;
  undefined1 auVar5 [8];
  class_<OmegaOP> *pcVar6;
  class_<OmegaSN> *pcVar7;
  arg local_148;
  module m;
  arg local_130;
  cpp_function cf;
  object local_110 [2];
  _Alloc_hider local_100;
  char local_f0 [16];
  undefined1 local_e0 [8];
  handle local_d8;
  handle local_d0;
  object local_c8;
  _Alloc_hider local_c0;
  char local_b0 [16];
  arg_v local_a0;
  arg local_60;
  arg local_50;
  _func_OmegaOP_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_40;
  int local_34;
  
  pcVar2 = (char *)Py_GetVersion();
  iVar1 = strncmp(pcVar2,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(pcVar2[4] - 0x30U))) {
    pybind11::module::module(&m,"slopeOP",(char *)0x0);
    pybind11::class_<PeltResult<float,_float>_>::class_<>
              ((class_<PeltResult<float,_float>_> *)&local_148,
               (handle)m.super_object.super_handle.m_ptr,"PeltResult");
    pcVar2 = local_148.name;
    local_a0.super_arg.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_e0 = (undefined1  [8])PyObject_GetAttrString(local_148.name,"__init__");
    if (local_e0 == (undefined1  [8])0x0) {
      PyErr_Clear();
      local_e0 = (undefined1  [8])&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    auVar5 = local_e0;
    cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record(&cf);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11::detail::initimpl::factory<pybind11_init_slopeOP(pybind11::module&)::$_0,pybind11::detail::void_type(*)(),PeltResult<float,float>*(std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::detail::void_type()>::execute<pybind11::class_<PeltResult<float,float>>>(pybind11::class_<PeltResult<float,float>>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double)#1},void,pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<PeltResult<float,float>>&&,void(*)(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "__init__";
    (pfVar3->scope).m_ptr = (PyObject *)pcVar2;
    (pfVar3->sibling).m_ptr = (PyObject *)auVar5;
    pfVar3->field_0x59 = pfVar3->field_0x59 | 0x42;
    pybind11::cpp_function::initialize_generic
              (&cf,pfVar3,"({%}, {List[int]}, {List[float]}, {List[float]}, {float}) -> None",
               (type_info **)
               pybind11::cpp_function::
               initialize<pybind11::detail::initimpl::factory<pybind11_init_slopeOP(pybind11::module&)::$_0,pybind11::detail::void_type(*)(),PeltResult<float,float>*(std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::detail::void_type()>::execute<pybind11::class_<PeltResult<float,float>>>(pybind11::class_<PeltResult<float,float>>&)&&::{lambda(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double)#1},void,pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<PeltResult<float,float>>&&,void(*)(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
               ::types,5);
    pybind11::object::~object((object *)local_e0);
    pybind11::object::~object((object *)&local_a0);
    pybind11::cpp_function::name((cpp_function *)&local_130);
    if ((PyObject *)local_130.name != (PyObject *)0x0) {
      *(Py_ssize_t *)local_130.name = *(Py_ssize_t *)local_130.name + 1;
    }
    local_d8.m_ptr = (PyObject *)local_148.name;
    local_d0.m_ptr = (PyObject *)local_130.name;
    local_a0.super_arg.name = (char *)0x0;
    local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::object::~object((object *)&local_a0);
    pybind11::detail::accessor_policies::obj_attr::set
              (local_d8,local_d0,(handle)cf.super_function.super_object.super_handle.m_ptr);
    pybind11::object::~object(&local_c8);
    pybind11::object::~object((object *)&local_d0);
    pybind11::object::~object((object *)&local_130);
    pybind11::object::~object((object *)&cf);
    pcVar4 = (class_<PeltResult<float,float>> *)
             pybind11::class_<PeltResult<float,float>>::
             def_readwrite<PeltResult<float,float>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       ((class_<PeltResult<float,float>> *)&local_148,"cp",0);
    pcVar4 = (class_<PeltResult<float,float>> *)
             pybind11::class_<PeltResult<float,float>>::
             def_readwrite<PeltResult<float,float>,std::vector<float,std::allocator<float>>>
                       (pcVar4,"x",0x18);
    pcVar4 = (class_<PeltResult<float,float>> *)
             pybind11::class_<PeltResult<float,float>>::
             def_readwrite<PeltResult<float,float>,std::vector<float,std::allocator<float>>>
                       (pcVar4,"y",0x30);
    pybind11::class_<PeltResult<float,float>>::def_readwrite<PeltResult<float,float>,double>
              (pcVar4,"cost",0x48);
    pybind11::object::~object((object *)&local_148);
    pybind11::class_<OmegaOP>::class_<>
              ((class_<OmegaOP> *)&local_148,(handle)m.super_object.super_handle.m_ptr,"OmegaOP");
    pcVar2 = local_148.name;
    local_a0.super_arg.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    auVar5 = (undefined1  [8])PyObject_GetAttrString(local_148.name,"GetChangepoints");
    if (auVar5 == (undefined1  [8])0x0) {
      PyErr_Clear();
      local_e0 = (undefined1  [8])&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      auVar5 = local_e0;
    }
    local_e0 = auVar5;
    auVar5 = local_e0;
    cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record(&cf);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11_init_slopeOP(pybind11::module&)::$_1,std::vector<int,std::allocator<int>>,OmegaOP_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_1&&,std::vector<int,std::allocator<int>>(*)(OmegaOP_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "GetChangepoints";
    pfVar3->field_0x59 = pfVar3->field_0x59 | 0x40;
    (pfVar3->scope).m_ptr = (PyObject *)pcVar2;
    (pfVar3->sibling).m_ptr = (PyObject *)auVar5;
    pfVar3->policy = copy;
    pybind11::cpp_function::initialize_generic
              (&cf,pfVar3,"({%}) -> List[int]",
               (type_info **)
               pybind11::cpp_function::
               initialize<pybind11_init_slopeOP(pybind11::module&)::$_1,std::vector<int,std::allocator<int>>,OmegaOP_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_1&&,std::vector<int,std::allocator<int>>(*)(OmegaOP_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
               ::types,1);
    pybind11::object::~object((object *)local_e0);
    pybind11::object::~object((object *)&local_a0);
    pybind11::cpp_function::name((cpp_function *)&local_130);
    if ((PyObject *)local_130.name != (PyObject *)0x0) {
      *(Py_ssize_t *)local_130.name = *(Py_ssize_t *)local_130.name + 1;
    }
    local_d8.m_ptr = (PyObject *)local_148.name;
    local_d0.m_ptr = (PyObject *)local_130.name;
    local_a0.super_arg.name = (char *)0x0;
    local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::object::~object((object *)&local_a0);
    pybind11::detail::accessor_policies::obj_attr::set
              (local_d8,local_d0,(handle)cf.super_function.super_object.super_handle.m_ptr);
    pybind11::object::~object(&local_c8);
    pybind11::object::~object((object *)&local_d0);
    pybind11::object::~object((object *)&local_130);
    pybind11::object::~object((object *)&cf);
    local_e0 = (undefined1  [8])OmegaOP::GetParameters;
    local_d8.m_ptr = (PyObject *)0x0;
    pcVar6 = pybind11::class_<OmegaOP>::
             def<std::vector<double,std::allocator<double>>(OmegaOP::*)()const>
                       ((class_<OmegaOP> *)&local_148,"GetParameters",
                        (offset_in_OmegaOP_to_subr *)local_e0);
    local_a0.super_arg.name = (char *)OmegaOP::GetGlobalCost;
    local_a0.super_arg._8_8_ = 0;
    pcVar6 = pybind11::class_<OmegaOP>::def<double(OmegaOP::*)()const>
                       (pcVar6,"GetGlobalCost",(offset_in_OmegaOP_to_subr *)&local_a0);
    cf.super_function.super_object.super_handle.m_ptr = (function)OmegaOP::GetPruning;
    pybind11::class_<OmegaOP>::def<double(OmegaOP::*)()const>
              (pcVar6,"GetPruning",(offset_in_OmegaOP_to_subr *)&cf);
    pybind11::object::~object((object *)&local_148);
    pybind11::class_<OmegaSN>::class_<>
              ((class_<OmegaSN> *)&local_148,(handle)m.super_object.super_handle.m_ptr,"OmegaSN");
    pcVar2 = local_148.name;
    local_a0.super_arg.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    auVar5 = (undefined1  [8])PyObject_GetAttrString(local_148.name,"GetChangepoints");
    if (auVar5 == (undefined1  [8])0x0) {
      PyErr_Clear();
      local_e0 = (undefined1  [8])&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      auVar5 = local_e0;
    }
    local_e0 = auVar5;
    auVar5 = local_e0;
    cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record(&cf);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11_init_slopeOP(pybind11::module&)::$_2,std::vector<int,std::allocator<int>>,OmegaSN_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_2&&,std::vector<int,std::allocator<int>>(*)(OmegaSN_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "GetChangepoints";
    pfVar3->field_0x59 = pfVar3->field_0x59 | 0x40;
    (pfVar3->scope).m_ptr = (PyObject *)pcVar2;
    (pfVar3->sibling).m_ptr = (PyObject *)auVar5;
    pfVar3->policy = copy;
    pybind11::cpp_function::initialize_generic
              (&cf,pfVar3,"({%}) -> List[int]",
               (type_info **)
               pybind11::cpp_function::
               initialize<pybind11_init_slopeOP(pybind11::module&)::$_2,std::vector<int,std::allocator<int>>,OmegaSN_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_2&&,std::vector<int,std::allocator<int>>(*)(OmegaSN_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
               ::types,1);
    pybind11::object::~object((object *)local_e0);
    pybind11::object::~object((object *)&local_a0);
    pybind11::cpp_function::name((cpp_function *)&local_130);
    if ((PyObject *)local_130.name != (PyObject *)0x0) {
      *(Py_ssize_t *)local_130.name = *(Py_ssize_t *)local_130.name + 1;
    }
    local_d8.m_ptr = (PyObject *)local_148.name;
    local_d0.m_ptr = (PyObject *)local_130.name;
    local_a0.super_arg.name = (char *)0x0;
    local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::object::~object((object *)&local_a0);
    pybind11::detail::accessor_policies::obj_attr::set
              (local_d8,local_d0,(handle)cf.super_function.super_object.super_handle.m_ptr);
    pybind11::object::~object(&local_c8);
    pybind11::object::~object((object *)&local_d0);
    pybind11::object::~object((object *)&local_130);
    pybind11::object::~object((object *)&cf);
    local_e0 = (undefined1  [8])OmegaSN::GetParameters;
    local_d8.m_ptr = (PyObject *)0x0;
    pcVar7 = pybind11::class_<OmegaSN>::
             def<std::vector<double,std::allocator<double>>(OmegaSN::*)()const>
                       ((class_<OmegaSN> *)&local_148,"GetParameters",
                        (offset_in_OmegaOP_to_subr *)local_e0);
    local_a0.super_arg.name = (char *)OmegaSN::GetGlobalCost;
    local_a0.super_arg._8_8_ = 0;
    pcVar7 = pybind11::class_<OmegaSN>::def<double(OmegaSN::*)()const>
                       (pcVar7,"GetGlobalCost",(offset_in_OmegaOP_to_subr *)&local_a0);
    cf.super_function.super_object.super_handle.m_ptr = (function)OmegaSN::GetPruning;
    pybind11::class_<OmegaSN>::def<double(OmegaSN::*)()const>
              (pcVar7,"GetPruning",(offset_in_OmegaOP_to_subr *)&cf);
    pybind11::object::~object((object *)&local_148);
    local_d8.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_d0.m_ptr = (PyObject *)0x120be1;
    local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0,
               (char (*) [45])"python interface to segmentaition algorithms");
    pybind11::object::~object(&local_c8);
    local_130.name = (char *)op2D_float;
    local_e0 = (undefined1  [8])((long)"vector<bool>::_M_insert_aux" + 0x1a);
    local_d8.m_ptr = (PyObject *)((ulong)local_d8.m_ptr & 0xfffffffffffffffc | 2);
    local_a0.super_arg.name = "y";
    local_a0.super_arg._8_8_ = local_a0.super_arg._8_8_ & 0xfffffffffffffffc | 2;
    cf.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_5108b;
    pybind11::module::
    def<PeltResult<float,float>(*)(std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,float),char[40],pybind11::arg,pybind11::arg,pybind11::arg>
              (&m,"op2D",
               (_func_PeltResult<float,_float>_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_float
                **)&local_130,(char (*) [40])"OP algorithm 2D (piece-wise linear fit)",
               (arg *)local_e0,&local_a0.super_arg,(arg *)&cf);
    local_40 = slopeOP;
    local_148.name = "data";
    local_148._8_1_ = local_148._8_1_ & 0xfc | 2;
    local_60.name = "states";
    local_60._8_1_ = local_60._8_1_ & 0xfc | 2;
    local_50.name = "penality";
    local_50._8_1_ = local_50._8_1_ & 0xfc | 2;
    local_a0.super_arg.name = "constraint";
    local_a0.super_arg._8_1_ = 2;
    pybind11::arg_v::arg_v<char_const(&)[5]>
              ((arg_v *)local_e0,&local_a0.super_arg,(char (*) [5])"null",(char *)0x0);
    local_34 = 0;
    cf.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_510de;
    pybind11::arg_v::arg_v<int>(&local_a0,(arg *)&cf,&local_34,(char *)0x0);
    local_130.name = "type";
    local_130._8_1_ = 2;
    pybind11::arg_v::arg_v<char_const(&)[8]>
              ((arg_v *)&cf,&local_130,(char (*) [8])"channel",(char *)0x0);
    pybind11::module::
    def<OmegaOP*(*)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string),char[18],pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
              (&m,"slopeOP",&local_40,(char (*) [18])"slopeOP algorithm",&local_148,&local_60,
               &local_50,(arg_v *)local_e0,&local_a0,(arg_v *)&cf);
    if (local_100._M_p != local_f0) {
      operator_delete(local_100._M_p);
    }
    pybind11::object::~object(local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.type._M_dataplus._M_p != &local_a0.type.field_2) {
      operator_delete(local_a0.type._M_dataplus._M_p);
    }
    pybind11::object::~object(&local_a0.value);
    if (local_c0._M_p != local_b0) {
      operator_delete(local_c0._M_p);
    }
    pybind11::object::~object((object *)&local_d0);
    local_60.name = (char *)slopeSN;
    cf.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_510af;
    local_130.name = "states";
    local_130._8_1_ = local_130._8_1_ & 0xfc | 2;
    local_148.name = "nb_segments";
    local_148._8_1_ = local_148._8_1_ & 0xfc | 2;
    local_a0.super_arg.name = "constraint";
    local_a0.super_arg._8_1_ = 2;
    pybind11::arg_v::arg_v<char_const(&)[5]>
              ((arg_v *)local_e0,&local_a0.super_arg,(char (*) [5])"null",(char *)0x0);
    pybind11::module::
    def<OmegaSN*(*)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,unsigned_int,std::__cxx11::string),char[18],pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
              (&m,"slopeSN",
               (_func_OmegaSN_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_uint_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                **)&local_60,(char (*) [18])"slopeSN algorithm",(arg *)&cf,&local_130,&local_148,
               (arg_v *)local_e0);
    if (local_c0._M_p != local_b0) {
      operator_delete(local_c0._M_p);
    }
    pybind11::object::~object((object *)&local_d0);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",pcVar2);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(slopeOP, m)
{
    py::class_<PeltResult<float, float>>(m, "PeltResult")
        .def(py::init([](vector<unsigned int> cp, vector<float> x, vector<float> y, double cost) {
            return new PeltResult<float, float>(cp, x, y, cost);
        }))
        .def_readwrite("cp", &PeltResult<float, float>::cp)
        .def_readwrite("x", &PeltResult<float, float>::x)
        .def_readwrite("y", &PeltResult<float, float>::y)
        .def_readwrite("cost", &PeltResult<float, float>::cost);

    py::class_<OmegaOP>(m, "OmegaOP")
        .def("GetChangepoints", [](const OmegaOP &a) {
                //
                std::vector<int> cp = a.GetChangepoints();
                for (size_t i=0; i<cp.size(); i++) {
                    cp[i] --;
                }
                return cp;
            }, pybind11::return_value_policy::copy)
        .def("GetParameters", &OmegaOP::GetParameters)
        .def("GetGlobalCost", &OmegaOP::GetGlobalCost)
        .def("GetPruning", &OmegaOP::GetPruning);

    py::class_<OmegaSN>(m, "OmegaSN")
        .def("GetChangepoints", [](const OmegaSN &a) {
                //
                std::vector<int> cp = a.GetChangepoints();
                for (size_t i=0; i<cp.size(); i++) {
                    cp[i] --;
                }
                return cp;
            }, pybind11::return_value_policy::copy)
        .def("GetParameters", &OmegaSN::GetParameters)
        .def("GetGlobalCost", &OmegaSN::GetGlobalCost)
        .def("GetPruning", &OmegaSN::GetPruning);

    m.doc() = "python interface to segmentaition algorithms"; // optional module docstring
    m.def("op2D", &op2D_float, "OP algorithm 2D (piece-wise linear fit)", py::arg("x"), py::arg("y"), py::arg("penality"));
    m.def("slopeOP", &slopeOP, "slopeOP algorithm", py::arg("data"), py::arg("states"), py::arg("penality"),
          py::arg("constraint") = "null", py::arg("minAngle") = 0, py::arg("type") = "channel");
    m.def("slopeSN", &slopeSN, "slopeSN algorithm", py::arg("data"), py::arg("states"), py::arg("nb_segments"),
          py::arg("constraint") = "null");
}